

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctionHandler.cpp
# Opt level: O0

bool __thiscall
ExpressionFunctionHandler::addFunction
          (ExpressionFunctionHandler *this,Identifier *name,ExpressionFunction functor,
          size_t minParams,size_t maxParams,ExpFuncSafety safety)

{
  bool bVar1;
  Entry local_98;
  undefined1 local_60 [8];
  anon_class_40_2_f5e256a9 executor;
  ExpFuncSafety safety_local;
  size_t maxParams_local;
  size_t minParams_local;
  ExpressionFunction functor_local;
  Identifier *name_local;
  ExpressionFunctionHandler *this_local;
  
  executor.functor._4_4_ = safety;
  Identifier::Identifier((Identifier *)local_60,name);
  executor.name._name.field_2._8_8_ = functor;
  std::
  function<ExpressionValue(std::vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>const&)>
  ::
  function<ExpressionFunctionHandler::addFunction(Identifier_const&,ExpressionValue(*)(Identifier_const&,std::vector<ExpressionValue,std::allocator<ExpressionValue>>const&),unsigned_long,unsigned_long,ExpFuncSafety)::__0,void>
            ((function<ExpressionValue(std::vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>const&)>
              *)&local_98,(anon_class_40_2_f5e256a9 *)local_60);
  local_98.safety = executor.functor._4_4_;
  local_98.minParams = minParams;
  local_98.maxParams = maxParams;
  bVar1 = registerEntry(this,name,&local_98);
  Entry::~Entry(&local_98);
  addFunction(Identifier_const&,ExpressionValue(*)(Identifier_const&,std::vector<ExpressionValue,std::allocator<ExpressionValue>>const&),unsigned_long,unsigned_long,ExpFuncSafety)
  ::$_0::~__0((__0 *)local_60);
  return bVar1;
}

Assistant:

bool ExpressionFunctionHandler::addFunction(const Identifier &name, ExpressionFunction functor, size_t minParams, size_t maxParams, ExpFuncSafety safety)
{
	auto executor = [name, functor](const std::vector<std::unique_ptr<ExpressionInternal>> &parameters) -> ExpressionValue
	{
		// evaluate parameters
		std::vector<ExpressionValue> params;
		params.reserve(parameters.size());

		for (size_t i = 0; i < parameters.size(); i++)
		{
			ExpressionValue result = parameters[i]->evaluate();
			if (!result.isValid())
			{
				Logger::queueError(Logger::Error, "%s: Invalid parameter %d", name, i+1);
				return result;
			}

			params.push_back(result);
		}

		// execute
		return functor(name, params);
	};

	return registerEntry(name, Entry{std::move(executor), minParams, maxParams, safety});
}